

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall kratos::IfStmt::remove_stmt(IfStmt *this,shared_ptr<kratos::Stmt> *stmt)

{
  bool bVar1;
  StmtBlock *pSVar2;
  reference psVar3;
  shared_ptr<kratos::Stmt> *s_1;
  iterator __end1_1;
  iterator __begin1_1;
  element_type *__range1_1;
  shared_ptr<kratos::Stmt> *s;
  iterator __end1;
  iterator __begin1;
  element_type *__range1;
  shared_ptr<kratos::Stmt> *stmt_local;
  IfStmt *this_local;
  
  pSVar2 = &std::
            __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->then_body_)->super_StmtBlock;
  __end1 = StmtBlock::begin(pSVar2);
  s = (shared_ptr<kratos::Stmt> *)StmtBlock::end(pSVar2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
                                     *)&s), bVar1) {
    psVar3 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
             ::operator*(&__end1);
    bVar1 = std::operator==(psVar3,stmt);
    if (bVar1) {
      remove_then_stmt(this,stmt);
      return;
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
    ::operator++(&__end1);
  }
  pSVar2 = &std::
            __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->else_body_)->super_StmtBlock;
  __end1_1 = StmtBlock::begin(pSVar2);
  s_1 = (shared_ptr<kratos::Stmt> *)StmtBlock::end(pSVar2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
                        *)&s_1);
    if (!bVar1) {
      return;
    }
    psVar3 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
             ::operator*(&__end1_1);
    bVar1 = std::operator==(psVar3,stmt);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
    ::operator++(&__end1_1);
  }
  remove_else_stmt(this,stmt);
  return;
}

Assistant:

void IfStmt::remove_stmt(const std::shared_ptr<kratos::Stmt> &stmt) {
    for (auto const &s : *then_body_) {
        if (s == stmt) {
            remove_then_stmt(stmt);
            return;
        }
    }
    for (auto const &s : *else_body_) {
        if (s == stmt) {
            remove_else_stmt(stmt);
            return;
        }
    }
}